

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# content_encoding.c
# Opt level: O1

CURLcode inflate_stream(connectdata *conn,contenc_writer *writer,zlibInitState started)

{
  void **zp;
  z_stream *z;
  int iVar1;
  content_encoding *pcVar2;
  bool bVar3;
  CURLcode CVar4;
  uint uVar5;
  CURLcode CVar6;
  int iVar7;
  content_encoding *pcVar8;
  
  zp = &writer->params;
  z = (z_stream *)(writer + 1);
  if ((*(uint *)&writer->params < 7) && ((0x66U >> (*(uint *)&writer->params & 0x1f) & 1) != 0)) {
    iVar1 = *(int *)&writer[1].downstream;
    pcVar2 = writer[1].handler;
    pcVar8 = (content_encoding *)(*Curl_cmalloc)(0x4000);
    if (pcVar8 != (content_encoding *)0x0) {
      CVar6 = CURLE_OK;
      do {
        writer[2].handler = pcVar8;
        *(undefined4 *)&writer[2].downstream = 0x4000;
        uVar5 = inflate(z,5);
        iVar7 = *(int *)&writer[2].downstream;
        CVar4 = CVar6;
        if (uVar5 < 2 && iVar7 != 0x4000) {
          *(zlibInitState *)&writer->params = started;
          CVar6 = (*writer->downstream->handler->unencode_write)
                            (conn,writer->downstream,(char *)pcVar8,
                             (long)iVar7 * 0xffffffff + 0x4000);
          CVar4 = CURLE_OK;
          if (CVar6 != CURLE_OK) {
            exit_zlib(conn,z,(zlibInitState *)zp,CVar6);
            break;
          }
        }
        CVar6 = CVar4;
        bVar3 = true;
        switch(uVar5) {
        case 0:
switchD_0012d3d9_caseD_0:
          bVar3 = false;
          break;
        case 1:
          CVar6 = process_trailer(conn,(zlib_params *)zp);
          break;
        case 0xfffffffb:
          break;
        case 0xfffffffd:
          if (*(int *)zp == 1) {
            inflateEnd(z);
            iVar7 = inflateInit2_(z,0xfffffff1,"1.2.11",0x70);
            if (iVar7 == 0) {
              writer[1].handler = pcVar2;
              *(int *)&writer[1].downstream = iVar1;
              *(undefined4 *)&writer->params = 2;
              goto switchD_0012d3d9_caseD_0;
            }
            *(undefined4 *)zp = 0;
          }
        default:
          process_zlib_error(conn,z);
          CVar6 = exit_zlib(conn,z,(zlibInitState *)zp,CURLE_BAD_CONTENT_ENCODING);
        }
      } while (!bVar3);
      (*Curl_cfree)(pcVar8);
      if ((iVar1 != 0) && (*(int *)zp == 1)) {
        *(zlibInitState *)zp = started;
      }
      return CVar6;
    }
    CVar6 = CURLE_OUT_OF_MEMORY;
  }
  else {
    CVar6 = CURLE_WRITE_ERROR;
  }
  CVar6 = exit_zlib(conn,z,(zlibInitState *)zp,CVar6);
  return CVar6;
}

Assistant:

static CURLcode inflate_stream(struct connectdata *conn,
                               contenc_writer *writer, zlibInitState started)
{
  zlib_params *zp = (zlib_params *) &writer->params;
  z_stream *z = &zp->z;         /* zlib state structure */
  uInt nread = z->avail_in;
  Bytef *orig_in = z->next_in;
  int status;                   /* zlib status */
  bool done = FALSE;
  CURLcode result = CURLE_OK;   /* Curl_client_write status */
  char *decomp;                 /* Put the decompressed data here. */

  /* Check state. */
  if(zp->zlib_init != ZLIB_INIT &&
     zp->zlib_init != ZLIB_INFLATING &&
     zp->zlib_init != ZLIB_INIT_GZIP &&
     zp->zlib_init != ZLIB_GZIP_INFLATING)
    return exit_zlib(conn, z, &zp->zlib_init, CURLE_WRITE_ERROR);

  /* Dynamically allocate a buffer for decompression because it's uncommonly
     large to hold on the stack */
  decomp = malloc(DSIZ);
  if(decomp == NULL)
    return exit_zlib(conn, z, &zp->zlib_init, CURLE_OUT_OF_MEMORY);

  /* because the buffer size is fixed, iteratively decompress and transfer to
     the client via downstream_write function. */
  while(!done) {
    done = TRUE;

    /* (re)set buffer for decompressed output for every iteration */
    z->next_out = (Bytef *) decomp;
    z->avail_out = DSIZ;

    status = inflate(z, Z_BLOCK);

    /* Flush output data if some. */
    if(z->avail_out != DSIZ) {
      if(status == Z_OK || status == Z_STREAM_END) {
        zp->zlib_init = started;      /* Data started. */
        result = Curl_unencode_write(conn, writer->downstream, decomp,
                                     DSIZ - z->avail_out);
        if(result) {
          exit_zlib(conn, z, &zp->zlib_init, result);
          break;
        }
      }
    }

    /* Dispatch by inflate() status. */
    switch(status) {
    case Z_OK:
      /* Always loop: there may be unflushed latched data in zlib state. */
      done = FALSE;
      break;
    case Z_BUF_ERROR:
      /* No more data to flush: just exit loop. */
      break;
    case Z_STREAM_END:
      result = process_trailer(conn, zp);
      break;
    case Z_DATA_ERROR:
      /* some servers seem to not generate zlib headers, so this is an attempt
         to fix and continue anyway */
      if(zp->zlib_init == ZLIB_INIT) {
        /* Do not use inflateReset2(): only available since zlib 1.2.3.4. */
        (void) inflateEnd(z);     /* don't care about the return code */
        if(inflateInit2(z, -MAX_WBITS) == Z_OK) {
          z->next_in = orig_in;
          z->avail_in = nread;
          zp->zlib_init = ZLIB_INFLATING;
          done = FALSE;
          break;
        }
        zp->zlib_init = ZLIB_UNINIT;    /* inflateEnd() already called. */
      }
      /* FALLTHROUGH */
    default:
      result = exit_zlib(conn, z, &zp->zlib_init, process_zlib_error(conn, z));
      break;
    }
  }
  free(decomp);

  /* We're about to leave this call so the `nread' data bytes won't be seen
     again. If we are in a state that would wrongly allow restart in raw mode
     at the next call, assume output has already started. */
  if(nread && zp->zlib_init == ZLIB_INIT)
    zp->zlib_init = started;      /* Cannot restart anymore. */

  return result;
}